

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  __uniq_ptr_data<option::Option,_std::default_delete<option::Option[]>,_true,_true> options_00;
  long lVar4;
  int argc_00;
  ulong uVar5;
  unique_ptr<option::Option[],_std::default_delete<option::Option[]>_> options;
  unique_ptr<option::Option[],_std::default_delete<option::Option[]>_> buffer;
  Stats stats;
  Parser parse;
  
  argc_00 = argc - (uint)(0 < argc);
  option::Stats::Stats(&stats,true,usage,argc_00,argv + (0 < argc_00),0,false);
  uVar5 = (ulong)stats.options_max * 0x30;
  options_00.super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t.
  super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
  super__Head_base<0UL,_option::Option_*,_false>._M_head_impl =
       (__uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>)
       operator_new__(uVar5);
  if ((ulong)stats.options_max != 0) {
    lVar4 = 0;
    do {
      *(undefined8 *)
       ((undefined1 *)
        ((long)options_00.
               super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t.
               super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
               super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 0x1c) + lVar4) = 0;
      *(undefined8 *)
       ((long)((undefined1 *)
               ((long)options_00.
                      super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                      .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 0x1c) + lVar4)
       + 8) = 0;
      puVar1 = (undefined8 *)
               ((long)((long)options_00.
                             super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                             .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 0x10) +
               lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined1 **)
       ((long)((long)options_00.
                     super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                     .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 8) + lVar4) =
           (undefined1 *)
           ((long)options_00.
                  super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t
                  .super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
                  super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 1) + lVar4;
      *(undefined1 **)
       ((long)options_00.
              super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t.
              super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
              super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + lVar4) =
           (undefined1 *)
           ((long)options_00.
                  super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t
                  .super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
                  super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 1) + lVar4;
      lVar4 = lVar4 + 0x30;
    } while (uVar5 - lVar4 != 0);
  }
  uVar5 = (ulong)stats.buffer_max * 0x30;
  options._M_t.super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t.
  super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
  super__Head_base<0UL,_option::Option_*,_false>._M_head_impl =
       (__uniq_ptr_data<option::Option,_std::default_delete<option::Option[]>,_true,_true>)
       (__uniq_ptr_data<option::Option,_std::default_delete<option::Option[]>,_true,_true>)
       options_00.super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t
       .super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
       super__Head_base<0UL,_option::Option_*,_false>._M_head_impl;
  buffer._M_t.super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t.
  super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
  super__Head_base<0UL,_option::Option_*,_false>._M_head_impl =
       (__uniq_ptr_data<option::Option,_std::default_delete<option::Option[]>,_true,_true>)
       operator_new__(uVar5);
  if ((ulong)stats.buffer_max != 0) {
    lVar4 = 0;
    do {
      *(undefined8 *)
       ((undefined1 *)
        ((long)buffer._M_t.
               super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t.
               super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
               super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 0x1c) + lVar4) = 0;
      *(undefined8 *)
       ((long)((undefined1 *)
               ((long)buffer._M_t.
                      super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                      .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 0x1c) + lVar4)
       + 8) = 0;
      puVar1 = (undefined8 *)
               ((long)((long)buffer._M_t.
                             super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                             .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 0x10) +
               lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined1 **)
       ((long)((long)buffer._M_t.
                     super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                     .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 8) + lVar4) =
           (undefined1 *)
           ((long)buffer._M_t.
                  super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t
                  .super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
                  super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 1) + lVar4;
      *(undefined1 **)
       ((long)buffer._M_t.
              super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t.
              super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
              super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + lVar4) =
           (undefined1 *)
           ((long)buffer._M_t.
                  super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t
                  .super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
                  super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 1) + lVar4;
      lVar4 = lVar4 + 0x30;
    } while (uVar5 - lVar4 != 0);
  }
  iVar3 = 1;
  option::Parser::Parser
            (&parse,true,usage,argc_00,argv + (0 < argc_00),
             (Option *)
             options_00.
             super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t.
             super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
             super__Head_base<0UL,_option::Option_*,_false>._M_head_impl,
             (Option *)
             buffer._M_t.
             super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>._M_t.
             super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>.
             super__Head_base<0UL,_option::Option_*,_false>._M_head_impl,0,false,-1);
  if ((parse.err != false) ||
     (iVar2 = option::Option::count
                        ((Option *)
                         options._M_t.
                         super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                         .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl),
     iVar2 == parse.op_count)) {
    std::operator<<((ostream *)&std::cerr,"Invalid options\n");
    option::printUsage<std::ostream>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,usage,0x50,0x32,0x4b);
    goto LAB_001037ee;
  }
  if ((argc_00 == 0) ||
     (*(long *)((long)options._M_t.
                      super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                      .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 0x40) != 0)) {
    option::printUsage<std::ostream>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,usage,0x50,0x32,0x4b);
  }
  else {
    if ((*(long *)((long)options._M_t.
                         super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                         .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 0x70) != 0)
       || (*(long *)((long)options._M_t.
                           super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                           .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 0xa0) != 0
          )) {
      iVar3 = cli::extract(&parse,(Option *)
                                  options._M_t.
                                  super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                                  .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl);
      goto LAB_001037ee;
    }
    if (*(long *)((long)options._M_t.
                        super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                        .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl + 0xd0) != 0) {
      iVar3 = cli::pack(&parse,(Option *)
                               options._M_t.
                               super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                               .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl);
      goto LAB_001037ee;
    }
  }
  iVar3 = 0;
LAB_001037ee:
  std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::~unique_ptr(&buffer);
  std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::~unique_ptr(&options);
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
	argc-=(argc>0); argv+=(argc>0); // Skip program name
	option::Stats stats(true, usage, argc, argv);
	std::unique_ptr<option::Option[]> options(new option::Option[stats.options_max]);
	std::unique_ptr<option::Option[]> buffer(new option::Option[stats.buffer_max]);
	option::Parser parse(true, usage, argc, argv, options.get(), buffer.get());

	if (parse.error() || (options[cli::UNKNOWN].count() == parse.optionsCount()))
	{
		std::cerr << "Invalid options\n";
		option::printUsage(std::cout, usage);
		return 1;
	}

	if (options[cli::HELP] || argc == 0)
	{
		option::printUsage(std::cout, usage);
		return 0;
	}

	if (options[cli::LIST] || options[cli::EXTRACT])
	{
		return cli::extract(parse, options.get());
	}
	else if (options[cli::PACK])
	{
		return cli::pack(parse, options.get());
	}

	return 0;
}